

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.h
# Opt level: O0

BOOL __thiscall
Js::TypedArray<int,_false,_false>::DirectSetItemAtRange
          (TypedArray<int,_false,_false> *this,int32 start,uint32 length,int typedValue)

{
  Type puVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  uint32 uVar5;
  uint32 uVar6;
  ScriptContext *scriptContext;
  undefined4 *puVar7;
  uint local_44;
  uint32 i;
  size_t byteSize;
  int *typedBuffer;
  uint local_28;
  uint32 newLength;
  uint32 newStart;
  int typedValue_local;
  uint32 length_local;
  int32 start_local;
  TypedArray<int,_false,_false> *this_local;
  
  BVar4 = CrossSite::IsCrossSiteObjectTyped<Js::TypedArray<int,false,false>>(this);
  if (BVar4 == 0) {
    bVar3 = Js::TypedArrayBase::IsDetachedBuffer(&this->super_TypedArrayBase);
    if (bVar3) {
      scriptContext = RecyclableObject::GetScriptContext((RecyclableObject *)this);
      JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ebe5,(PCWSTR)0x0);
    }
    typedBuffer._4_4_ = length;
    local_28 = start;
    if (start < 0) {
      if ((long)((ulong)length + (long)start) < 0) {
        return 1;
      }
      local_28 = 0;
      typedBuffer._4_4_ = start + length;
    }
    uVar5 = ArrayObject::GetLength((ArrayObject *)this);
    if (local_28 < uVar5) {
      uVar5 = UInt32Math::Add(local_28,typedBuffer._4_4_);
      uVar6 = ArrayObject::GetLength((ArrayObject *)this);
      if (uVar6 < uVar5) {
        uVar5 = ArrayObject::GetLength((ArrayObject *)this);
        typedBuffer._4_4_ = uVar5 - local_28;
      }
      puVar1 = (this->super_TypedArrayBase).buffer;
      if (typedValue == 0) {
        if ((ulong)typedBuffer._4_4_ << 2 < (ulong)typedBuffer._4_4_) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/TypedArray.h"
                                      ,0x1ab,"(byteSize >= newLength)","byteSize >= newLength");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar7 = 0;
        }
        memset(puVar1 + (ulong)local_28 * 4,0,(ulong)typedBuffer._4_4_ << 2);
      }
      else {
        for (local_44 = 0; local_44 < typedBuffer._4_4_; local_44 = local_44 + 1) {
          *(int *)(puVar1 + (ulong)(local_28 + local_44) * 4) = typedValue;
        }
      }
      this_local._4_4_ = 1;
    }
    else {
      this_local._4_4_ = 1;
    }
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

inline BOOL DirectSetItemAtRange(__in int32 start, __in uint32 length, __in TypeName typedValue)
        {
            if (CrossSite::IsCrossSiteObjectTyped(this))
            {
                return false;
            }

            if (this->IsDetachedBuffer()) // 9.4.5.9 IntegerIndexedElementSet
            {
                JavascriptError::ThrowTypeError(GetScriptContext(), JSERR_DetachedTypedArray);
            }
            uint32 newStart = start, newLength = length;

            if (start < 0)
            {
                if ((int64)(length) + start < 0)
                {
                    // nothing to do, all index are no-op
                    return true;
                }
                newStart = 0;
                // fixup the length with the change
                newLength += start;
            }
            if (newStart >= GetLength())
            {
                // If we want to start copying past the length of the array, all index are no-op
                return true;
            }
            if (UInt32Math::Add(newStart, newLength) > GetLength())
            {
                newLength = GetLength() - newStart;
            }

            TypeName* typedBuffer = (TypeName*)buffer;

            if (typedValue == 0 || sizeof(TypeName) == 1)
            {
                const size_t byteSize = sizeof(TypeName) * newLength;
                Assert(byteSize >= newLength); // check for overflow
                memset(typedBuffer + newStart, (int)typedValue, byteSize);
            }
            else
            {
                for (uint32 i = 0; i < newLength; i++)
                {
                    typedBuffer[newStart + i] = typedValue;
                }
            }

            return TRUE;
        }